

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_binder.cpp
# Opt level: O2

void duckdb::IndexBinder::InitCreateIndexInfo(LogicalGet *get,CreateIndexInfo *info,string *schema)

{
  pointer pCVar1;
  CreateIndexInfo *pCVar2;
  LogicalGet *this;
  vector<duckdb::ColumnIndex,_true> *pvVar3;
  reference __x;
  TableCatalogEntry *pTVar4;
  BinderException *this_00;
  pointer pCVar5;
  allocator local_69;
  string *local_68;
  CreateIndexInfo *local_60;
  LogicalGet *local_58;
  idx_t col_id;
  
  local_68 = schema;
  pvVar3 = LogicalGet::GetColumnIds(get);
  pCVar5 = (pvVar3->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (pvVar3->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_60 = info;
  local_58 = get;
  while( true ) {
    if (pCVar5 == pCVar1) {
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                 &info->scan_types,&LogicalType::ROW_TYPE);
      this = local_58;
      pCVar2 = local_60;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_60->names,
                  &(local_58->names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
      ::std::__cxx11::string::_M_assign((string *)&(pCVar2->super_CreateInfo).schema);
      col_id = (idx_t)LogicalGet::GetTable(this);
      pTVar4 = optional_ptr<duckdb::TableCatalogEntry,_true>::operator->
                         ((optional_ptr<duckdb::TableCatalogEntry,_true> *)&col_id);
      Catalog::GetName_abi_cxx11_((pTVar4->super_StandardEntry).super_InCatalogEntry.catalog);
      ::std::__cxx11::string::_M_assign((string *)&(pCVar2->super_CreateInfo).catalog);
      LogicalGet::AddColumnId(this,0xffffffffffffffff);
      return;
    }
    if (pCVar5->index == 0xffffffffffffffff) break;
    col_id = pCVar5->index;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&info->column_ids,&col_id);
    __x = vector<duckdb::LogicalType,_true>::get<true>(&get->returned_types,col_id);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&(info->scan_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
    pCVar5 = pCVar5 + 1;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&col_id,"cannot create an index on the rowid",&local_69);
  BinderException::BinderException(this_00,(string *)&col_id);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void IndexBinder::InitCreateIndexInfo(LogicalGet &get, CreateIndexInfo &info, const string &schema) {
	auto &column_ids = get.GetColumnIds();
	for (auto &column_id : column_ids) {
		if (column_id.IsRowIdColumn()) {
			throw BinderException("cannot create an index on the rowid");
		}
		auto col_id = column_id.GetPrimaryIndex();
		info.column_ids.push_back(col_id);
		info.scan_types.push_back(get.returned_types[col_id]);
	}

	info.scan_types.emplace_back(LogicalType::ROW_TYPE);
	info.names = get.names;
	info.schema = schema;
	info.catalog = get.GetTable()->catalog.GetName();
	get.AddColumnId(COLUMN_IDENTIFIER_ROW_ID);
}